

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_NtkBalanceMux(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize,
                      int nGroups,int nMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  int iVar1;
  int iLit1;
  int iLit0;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = 0;
  iVar3 = 0;
  if (0 < nMuxes) {
    iVar3 = nMuxes;
  }
  if (nGroups < 1) {
    nGroups = 0;
  }
  for (; iVar2 != nGroups; iVar2 = iVar2 + 1) {
    iVar1 = Str_MuxRestructure(pNew,p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 4),nMuxes,vDelay
                               ,nLutSize,fRecursive,fOptArea,fVerbose);
    iVar4 = iVar3;
    if (iVar1 == -1) {
      while (iVar4 != 0) {
        iVar1 = Str_ObjFaninCopy(p,pObj,2);
        iLit1 = Str_ObjFaninCopy(p,pObj,1);
        iLit0 = Str_ObjFaninCopy(p,pObj,0);
        iVar1 = Gia_ManHashMuxReal(pNew,iVar1,iLit1,iLit0);
        pObj->iCopy = iVar1;
        iVar1 = Abc_Lit2Var(iVar1);
        Str_ObjDelay(pNew,iVar1,nLutSize,vDelay);
        pObj = pObj + 1;
        iVar4 = iVar4 + -1;
      }
    }
    else {
      pObj[nMuxes + -1].iCopy = iVar1;
      pObj = pObj + (long)(nMuxes + -1) + 1;
    }
  }
  return;
}

Assistant:

void Str_NtkBalanceMux( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize, int nGroups, int nMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose );
    int n, m, iRes, fUseRestruct = 1;
    if ( fUseRestruct )
    {
        for ( n = 0; n < nGroups; n++ )
        {            
            iRes = Str_MuxRestructure( pNew, p, Str_ObjId(p, pObj), nMuxes, vDelay, nLutSize, fRecursive, fOptArea, fVerbose );
            if ( iRes == -1 )
            {
                for ( m = 0; m < nMuxes; m++, pObj++ )
                {
                    pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
                    Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
                }
            }
            else
            {
                pObj += nMuxes - 1;
                pObj->iCopy = iRes;
                pObj++;
            }
        }
    }
    else
    {
        for ( n = 0; n < nGroups * nMuxes; n++, pObj++ )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
    }
}